

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.c
# Opt level: O0

uint key_derivation(uchar *plaintext,int plaintext_len,uchar *key,int key_len,uchar *digest)

{
  int len_00;
  uchar *key_00;
  HMAC_CTX *ctx_00;
  EVP_MD *md;
  uint local_3c;
  HMAC_CTX *pHStack_38;
  uint len;
  HMAC_CTX *ctx;
  uchar *digest_local;
  uchar *puStack_20;
  int key_len_local;
  uchar *key_local;
  uchar *puStack_10;
  int plaintext_len_local;
  uchar *plaintext_local;
  
  ctx = (HMAC_CTX *)digest;
  digest_local._4_4_ = key_len;
  puStack_20 = key;
  key_local._4_4_ = plaintext_len;
  puStack_10 = plaintext;
  ctx_00 = (HMAC_CTX *)HMAC_CTX_new();
  key_00 = puStack_20;
  len_00 = digest_local._4_4_;
  pHStack_38 = ctx_00;
  md = EVP_md5();
  HMAC_Init_ex(ctx_00,key_00,len_00,md,(ENGINE *)0x0);
  HMAC_Update(pHStack_38,puStack_10,(long)key_local._4_4_);
  HMAC_Final(pHStack_38,(uchar *)ctx,&local_3c);
  HMAC_CTX_free(pHStack_38);
  return local_3c;
}

Assistant:

unsigned int key_derivation(unsigned char *plaintext, int plaintext_len,
                            unsigned char *key, int key_len,
                            unsigned char *digest) {
    HMAC_CTX *ctx;

    unsigned int len;

    /* Create and initialise the context */
    ctx = HMAC_CTX_new();

    /* Initialise the decryption operation. */
    HMAC_Init_ex(ctx, key, key_len, EVP_md5(), NULL);

    /* compute the digest */
    HMAC_Update(ctx, plaintext, plaintext_len);

    /* Finalise the digest */
    HMAC_Final(ctx, digest, &len);

    /* Clean up */
    HMAC_CTX_free(ctx);

    return len;
}